

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O3

void nsdiffstest(void)

{
  uint uVar1;
  double local_4a8;
  double x [144];
  double local_20;
  double alpha;
  int max_D;
  
  memcpy(&local_4a8,&DAT_00157ff0,0x480);
  local_20 = 0.05;
  alpha._4_4_ = 1;
  uVar1 = nsdiffs(&local_4a8,0x90,0xc,&local_20,"seas",(int *)((long)&alpha + 4));
  printf("%d \n",(ulong)uVar1);
  return;
}

Assistant:

void nsdiffstest() {
	double x[144] = {112, 118, 132, 129, 121, 135, 148, 148, 136, 119, 104, 118,
        115, 126, 141, 135, 125, 149, 170, 170, 158, 133, 114, 140,
        145, 150, 178, 163, 172, 178, 199, 199, 184, 162, 146, 166,
        171, 180, 193, 181, 183, 218, 230, 242, 209, 191, 172, 194,
        196, 196, 236, 235, 229, 243, 264, 272, 237, 211, 180, 201,
        204, 188, 235, 227, 234, 264, 302, 293, 259, 229, 203, 229,
        242, 233, 267, 269, 270, 315, 364, 347, 312, 274, 237, 278,
        284, 277, 317, 313, 318, 374, 413, 405, 355, 306, 271, 306,
        315, 301, 356, 348, 355, 422, 465, 467, 404, 347, 305, 336,
        340, 318, 362, 348, 363, 435, 491, 505, 404, 359, 310, 337,
        360, 342, 406, 396, 420, 472, 548, 559, 463, 407, 362, 405,
        417, 391, 419, 461, 472, 535, 622, 606, 508, 461, 390, 432
	};

	int N = 144;
	int f = 12;
	double alpha = 0.05;
	const char *test = "seas";
	int max_D = 1;
	int D;

	//d = ndiffs(x,N,&alpha,test,&max_d);

	D = nsdiffs(x,N,f,&alpha,test,&max_D);

	printf("%d \n",D);
}